

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.cpp
# Opt level: O0

int __thiscall basisu::huffman_encoding_table::init(huffman_encoding_table *this,EVP_PKEY_CTX *ctx)

{
  ushort uVar1;
  uint16_t uVar2;
  huffman_encoding_table *phVar3;
  reference pvVar4;
  uchar *puVar5;
  unsigned_short *puVar6;
  huffman_encoding_table *extraout_RAX;
  uint in_ECX;
  long in_RDX;
  ulong __n;
  uint32_t l_1;
  uint32_t code_size;
  uint32_t code;
  uint32_t rev_code;
  uint32_t i_5;
  uint32_t i_4;
  uint32_t j_2;
  uint32_t next_code [32];
  uint32_t l;
  uint32_t j_1;
  uint32_t i_3;
  uint32_t i_2;
  int num_codes [32];
  sym_freq *pSym_freq;
  uint32_t j;
  uint32_t i_1;
  vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_> sym_freq1;
  vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_> sym_freq0;
  uint32_t i;
  uint32_t total_used_syms;
  sym_freq *in_stack_000009f0;
  sym_freq *in_stack_000009f8;
  uint32_t in_stack_00000a04;
  size_t in_stack_fffffffffffffda8;
  undefined6 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb6;
  undefined1 in_stack_fffffffffffffdb7;
  size_t in_stack_fffffffffffffdb8;
  vector<unsigned_short> *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  uchar uVar7;
  vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_> *in_stack_fffffffffffffdd0;
  uint local_1d4;
  uint local_1cc;
  uint local_1c8;
  uint local_1c4;
  uint local_1c0;
  uint local_1bc;
  uint auStack_1b8 [35];
  int local_12c;
  uint local_128;
  uint local_124;
  undefined4 local_120;
  uint local_11c;
  int local_118 [34];
  sym_freq *local_90;
  uint local_84;
  uint local_80;
  vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_> local_78 [2];
  vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_> local_48;
  uint local_2c;
  uint local_28;
  uint local_24;
  long local_20;
  uint local_14;
  huffman_encoding_table *local_10;
  undefined1 local_1;
  
  local_14 = (uint)ctx;
  phVar3 = this;
  if (in_ECX < 0x11) {
    if ((local_14 == 0) || (0x4000 < local_14)) {
      local_1 = 0;
    }
    else {
      local_28 = 0;
      for (local_2c = 0; phVar3 = (huffman_encoding_table *)(ulong)local_2c, local_2c < local_14;
          local_2c = local_2c + 1) {
        if (*(short *)(in_RDX + (ulong)local_2c * 2) != 0) {
          local_28 = local_28 + 1;
        }
      }
      if (local_28 == 0) {
        local_1 = 0;
      }
      else {
        local_24 = in_ECX;
        local_20 = in_RDX;
        local_10 = this;
        std::allocator<basisu::sym_freq>::allocator((allocator<basisu::sym_freq> *)0x4cf884);
        std::vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>::vector
                  (in_stack_fffffffffffffdd0,
                   CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
                   (allocator_type *)in_stack_fffffffffffffdc0);
        std::allocator<basisu::sym_freq>::~allocator((allocator<basisu::sym_freq> *)0x4cf8aa);
        std::allocator<basisu::sym_freq>::allocator((allocator<basisu::sym_freq> *)0x4cf8c8);
        std::vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>::vector
                  (in_stack_fffffffffffffdd0,
                   CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
                   (allocator_type *)in_stack_fffffffffffffdc0);
        std::allocator<basisu::sym_freq>::~allocator((allocator<basisu::sym_freq> *)0x4cf8ee);
        local_84 = 0;
        for (local_80 = 0; local_80 < local_14; local_80 = local_80 + 1) {
          if (*(short *)(local_20 + (ulong)local_80 * 2) != 0) {
            uVar1 = *(ushort *)(local_20 + (ulong)local_80 * 2);
            pvVar4 = std::vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>::operator[]
                               (&local_48,(ulong)local_84);
            pvVar4->m_key = (uint)uVar1;
            uVar2 = (uint16_t)local_80;
            __n = (ulong)local_84;
            local_84 = local_84 + 1;
            pvVar4 = std::vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>::operator[]
                               (&local_48,__n);
            pvVar4->m_sym_index = uVar2;
          }
        }
        std::vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>::operator[](&local_48,0);
        std::vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>::operator[](local_78,0);
        local_90 = canonical_huffman_radix_sort_syms
                             (in_stack_00000a04,in_stack_000009f8,in_stack_000009f0);
        canonical_huffman_calculate_minimum_redundancy(local_90,local_28);
        clear_obj<int[32]>((int (*) [32])0x4cfa82);
        for (local_11c = 0; local_11c < local_28; local_11c = local_11c + 1) {
          if (0x1f < local_90[local_11c].m_key) {
            local_1 = 0;
            goto LAB_004cfe30;
          }
          local_118[local_90[local_11c].m_key] = local_118[local_90[local_11c].m_key] + 1;
        }
        canonical_huffman_enforce_max_code_size(local_118,local_28,local_24);
        vector<unsigned_char>::resize
                  ((vector<unsigned_char> *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                   (bool)in_stack_fffffffffffffdb7);
        vector<unsigned_char>::resize
                  ((vector<unsigned_char> *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                   (bool)in_stack_fffffffffffffdb7);
        vector<unsigned_short>::resize
                  (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                   (bool)in_stack_fffffffffffffdb7);
        vector<unsigned_short>::resize
                  (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                   (bool)in_stack_fffffffffffffdb7);
        local_128 = local_28;
        for (local_124 = 1; local_124 <= local_24; local_124 = local_124 + 1) {
          for (local_12c = local_118[local_124]; local_12c != 0; local_12c = local_12c + -1) {
            local_128 = local_128 - 1;
            uVar7 = (uchar)local_124;
            puVar5 = vector<unsigned_char>::operator[]
                               ((vector<unsigned_char> *)
                                CONCAT17(in_stack_fffffffffffffdb7,
                                         CONCAT16(in_stack_fffffffffffffdb6,
                                                  in_stack_fffffffffffffdb0)),
                                in_stack_fffffffffffffda8);
            *puVar5 = uVar7;
          }
        }
        auStack_1b8[1] = 0;
        local_1bc = 0;
        for (local_1c0 = 2; local_1c0 <= local_24; local_1c0 = local_1c0 + 1) {
          local_1bc = (local_1bc + local_118[local_1c0 - 1]) * 2;
          auStack_1b8[local_1c0] = local_1bc;
        }
        for (local_1c4 = 0; local_1c4 < local_14; local_1c4 = local_1c4 + 1) {
          local_1c8 = 0;
          in_stack_fffffffffffffdc0 =
               (vector<unsigned_short> *)
               vector<unsigned_char>::operator[]
                         ((vector<unsigned_char> *)
                          CONCAT17(in_stack_fffffffffffffdb7,
                                   CONCAT16(in_stack_fffffffffffffdb6,in_stack_fffffffffffffdb0)),
                          in_stack_fffffffffffffda8);
          local_1d4 = (uint)*(byte *)&in_stack_fffffffffffffdc0->m_p;
          if (local_1d4 != 0) {
            if (0x1f < local_1d4) {
              local_1 = 0;
              goto LAB_004cfe30;
            }
            local_1cc = auStack_1b8[local_1d4];
            auStack_1b8[local_1d4] = local_1cc + 1;
            for (; local_1d4 != 0; local_1d4 = local_1d4 - 1) {
              local_1c8 = local_1c8 << 1 | local_1cc & 1;
              local_1cc = local_1cc >> 1;
            }
            in_stack_fffffffffffffdb6 = (undefined1)local_1c8;
            in_stack_fffffffffffffdb7 = (undefined1)(local_1c8 >> 8);
            puVar6 = vector<unsigned_short>::operator[]
                               ((vector<unsigned_short> *)
                                CONCAT17(in_stack_fffffffffffffdb7,
                                         CONCAT16(in_stack_fffffffffffffdb6,
                                                  in_stack_fffffffffffffdb0)),
                                in_stack_fffffffffffffda8);
            *puVar6 = CONCAT11(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb6);
          }
        }
        local_1 = 1;
LAB_004cfe30:
        local_120 = 1;
        std::vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>::~vector
                  ((vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_> *)
                   in_stack_fffffffffffffdc0);
        std::vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>::~vector
                  ((vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_> *)
                   in_stack_fffffffffffffdc0);
        phVar3 = extraout_RAX;
      }
    }
  }
  else {
    local_1 = 0;
  }
  return (uint)CONCAT71((int7)((ulong)phVar3 >> 8),local_1) & 0xffffff01;
}

Assistant:

bool huffman_encoding_table::init(uint32_t num_syms, const uint16_t *pFreq, uint32_t max_code_size)
	{
		if (max_code_size > cHuffmanMaxSupportedCodeSize)
			return false;
		if ((!num_syms) || (num_syms > cHuffmanMaxSyms))
			return false;

		uint32_t total_used_syms = 0;
		for (uint32_t i = 0; i < num_syms; i++)
			if (pFreq[i])
				total_used_syms++;

		if (!total_used_syms)
			return false;

		std::vector<sym_freq> sym_freq0(total_used_syms), sym_freq1(total_used_syms);
		for (uint32_t i = 0, j = 0; i < num_syms; i++)
		{
			if (pFreq[i])
			{
				sym_freq0[j].m_key = pFreq[i];
				sym_freq0[j++].m_sym_index = static_cast<uint16_t>(i);
			}
		}

		sym_freq *pSym_freq = canonical_huffman_radix_sort_syms(total_used_syms, &sym_freq0[0], &sym_freq1[0]);

		canonical_huffman_calculate_minimum_redundancy(pSym_freq, total_used_syms);

		int num_codes[cHuffmanMaxSupportedInternalCodeSize + 1];
		clear_obj(num_codes);

		for (uint32_t i = 0; i < total_used_syms; i++)
		{
			if (pSym_freq[i].m_key > cHuffmanMaxSupportedInternalCodeSize)
				return false;

			num_codes[pSym_freq[i].m_key]++;
		}

		canonical_huffman_enforce_max_code_size(num_codes, total_used_syms, max_code_size);

		m_code_sizes.resize(0);
		m_code_sizes.resize(num_syms);

		m_codes.resize(0);
		m_codes.resize(num_syms);

		for (uint32_t i = 1, j = total_used_syms; i <= max_code_size; i++)
			for (uint32_t l = num_codes[i]; l > 0; l--)
				m_code_sizes[pSym_freq[--j].m_sym_index] = static_cast<uint8_t>(i);

		uint32_t next_code[cHuffmanMaxSupportedInternalCodeSize + 1];

		next_code[1] = 0;
		for (uint32_t j = 0, i = 2; i <= max_code_size; i++)
			next_code[i] = j = ((j + num_codes[i - 1]) << 1);

		for (uint32_t i = 0; i < num_syms; i++)
		{
			uint32_t rev_code = 0, code, code_size;
			if ((code_size = m_code_sizes[i]) == 0)
				continue;
			if (code_size > cHuffmanMaxSupportedInternalCodeSize)
				return false;
			code = next_code[code_size]++;
			for (uint32_t l = code_size; l > 0; l--, code >>= 1)
				rev_code = (rev_code << 1) | (code & 1);
			m_codes[i] = static_cast<uint16_t>(rev_code);
		}

		return true;
	}